

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

void nn_pipebase_init(nn_pipebase *self,nn_pipebase_vfptr *vfptr,nn_ep *ep)

{
  nn_fsm *in_RDX;
  void *in_RSI;
  long in_RDI;
  
  if (in_RDX[1].shutdown_fn == (nn_fsm_fn)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","ep->sock",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/core/pipe.c"
            ,0x35);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_fsm_init(&self->fsm,(nn_fsm_fn)vfptr,(nn_fsm_fn)ep,(int)((ulong)in_RDI >> 0x20),in_RSI,in_RDX);
  *(void **)(in_RDI + 0x58) = in_RSI;
  *(undefined1 *)(in_RDI + 0x60) = 1;
  *(undefined1 *)(in_RDI + 0x61) = 0;
  *(undefined1 *)(in_RDI + 0x62) = 0;
  *(nn_fsm_fn *)(in_RDI + 0x68) = in_RDX[1].shutdown_fn;
  *(undefined8 *)(in_RDI + 200) = *(undefined8 *)&in_RDX[1].state;
  *(undefined4 *)(in_RDI + 0xd0) = *(undefined4 *)&in_RDX[1].srcptr;
  nn_fsm_event_init((nn_fsm_event *)0x145ce9);
  nn_fsm_event_init((nn_fsm_event *)0x145cfa);
  return;
}

Assistant:

void nn_pipebase_init (struct nn_pipebase *self,
    const struct nn_pipebase_vfptr *vfptr, struct nn_ep *ep)
{
    nn_assert (ep->sock);

    nn_fsm_init (&self->fsm, NULL, NULL, 0, self, &ep->sock->fsm);
    self->vfptr = vfptr;
    self->state = NN_PIPEBASE_STATE_IDLE;
    self->instate = NN_PIPEBASE_INSTATE_DEACTIVATED;
    self->outstate = NN_PIPEBASE_OUTSTATE_DEACTIVATED;
    self->sock = ep->sock;
    memcpy (&self->options, &ep->options, sizeof (struct nn_ep_options));
    nn_fsm_event_init (&self->in);
    nn_fsm_event_init (&self->out);
}